

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O3

ON_UserData * __thiscall
ON_Object::TransferUserDataItem
          (ON_Object *this,ON_UserData *source_ud_copy_this,ON_UserData *source_ud_move_this,
          bool bPerformConflictCheck,UserDataConflictResolution userdata_conflict_resolution)

{
  bool bVar1;
  ON_UserData *p;
  _func_int **pp_Var2;
  char *sFormat;
  int line_number;
  ON_UserData *pOVar3;
  ON_UserData *this_00;
  
  if (source_ud_move_this == (ON_UserData *)0x0) {
    if (source_ud_copy_this == (ON_UserData *)0x0) {
      return (ON_UserData *)0x0;
    }
    this_00 = source_ud_copy_this;
    if (source_ud_copy_this->m_userdata_owner == this) {
      sFormat = "source_ud_copy_this is already attached to this object.";
      line_number = 0x5cb;
      goto LAB_00553e36;
    }
  }
  else {
    if (source_ud_copy_this != (ON_UserData *)0x0) {
      sFormat = "At most one source_ud pointer can be not null.";
      line_number = 0x5bd;
      goto LAB_00553e36;
    }
    if ((source_ud_move_this->m_userdata_owner != (ON_Object *)0x0) ||
       (this_00 = source_ud_move_this, source_ud_move_this->m_userdata_next != (ON_UserData *)0x0))
    {
      sFormat = "Cannot move userdata that is attached to another object.";
      line_number = 0x5c2;
      goto LAB_00553e36;
    }
  }
  bVar1 = ON_UserData::IsUnknownUserData(this_00);
  if (bVar1) {
    ON_UnknownUserData::Cast(&this_00->super_ON_Object);
  }
  bVar1 = true;
  if (!bPerformConflictCheck) {
    pOVar3 = (ON_UserData *)0x0;
    goto switchD_00553dc8_caseD_1;
  }
  p = GetUserData(this,&this_00->m_userdata_uuid);
  if (p == (ON_UserData *)0x0) {
    bVar1 = true;
    pOVar3 = (ON_UserData *)0x0;
    goto switchD_00553dc8_caseD_1;
  }
  bVar1 = false;
  pOVar3 = p;
  switch(userdata_conflict_resolution) {
  case source_object:
    break;
  case source_copycount_gt:
    bVar1 = false;
    if (this_00->m_userdata_copycount <= p->m_userdata_copycount) {
      return (ON_UserData *)0x0;
    }
    break;
  case source_copycount_ge:
    bVar1 = false;
    if (this_00->m_userdata_copycount < p->m_userdata_copycount) {
      return (ON_UserData *)0x0;
    }
    break;
  case destination_copycount_gt:
    bVar1 = false;
    if (p->m_userdata_copycount <= this_00->m_userdata_copycount) {
      return (ON_UserData *)0x0;
    }
    break;
  case destination_copycount_ge:
    bVar1 = false;
    if (p->m_userdata_copycount < this_00->m_userdata_copycount) {
      return (ON_UserData *)0x0;
    }
    break;
  case delete_item:
    pp_Var2 = (p->super_ON_Object)._vptr_ON_Object;
    goto LAB_00553f17;
  default:
    goto LAB_00553f1c;
  }
switchD_00553dc8_caseD_1:
  if (source_ud_copy_this == (ON_UserData *)0x0) {
    if (source_ud_move_this == (ON_UserData *)0x0) {
      sFormat = "Bug in the code above.";
      line_number = 0x62b;
LAB_00553e36:
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                 ,line_number,"",sFormat);
      return (ON_UserData *)0x0;
    }
LAB_00553e88:
    if (!bVar1) {
      (*(pOVar3->super_ON_Object)._vptr_ON_Object[4])(pOVar3);
    }
    source_ud_move_this->m_userdata_owner = this;
    source_ud_move_this->m_userdata_next = this->m_userdata_list;
    this->m_userdata_list = source_ud_move_this;
    return source_ud_move_this;
  }
  p = ON_UserData::Duplicate(source_ud_copy_this);
  if (p != (ON_UserData *)0x0) {
    source_ud_move_this = ON_UserData::Cast(&p->super_ON_Object);
    if (source_ud_move_this != (ON_UserData *)0x0) {
      source_ud_move_this->m_userdata_owner = (ON_Object *)0x0;
      goto LAB_00553e88;
    }
    pp_Var2 = (p->super_ON_Object)._vptr_ON_Object;
LAB_00553f17:
    (*pp_Var2[4])(p);
  }
LAB_00553f1c:
  return (ON_UserData *)0x0;
}

Assistant:

ON_UserData* ON_Object::TransferUserDataItem(
  const ON_UserData* source_ud_copy_this,
  ON_UserData* source_ud_move_this,
  bool bPerformConflictCheck,
  ON_Object::UserDataConflictResolution userdata_conflict_resolution
  )
{
  const ON_UserData* source_ud; // do not initialize so compiler will detect future bugs

  if (nullptr != source_ud_move_this)
  {
    if (nullptr != source_ud_copy_this)
    {
      ON_ERROR("At most one source_ud pointer can be not null.");
      return nullptr;
    }
    if (nullptr != source_ud_move_this->m_userdata_owner || nullptr != source_ud_move_this->m_userdata_next)
    {
      ON_ERROR("Cannot move userdata that is attached to another object.");
      return nullptr;
    }
    source_ud = source_ud_move_this;
  }
  else if ( nullptr != source_ud_copy_this )
  {
    if (this == source_ud_copy_this->m_userdata_owner)
    {
      ON_ERROR("source_ud_copy_this is already attached to this object.");
      return nullptr;
    }
    source_ud = source_ud_copy_this;
  }
  else
  {
    // nothing to do
    return nullptr;
  }

  if (source_ud->IsUnknownUserData())
  {
    // make sure we have valid user data - the first beta release of Rhino 2.0 
    // created empty user data.
    const ON_UnknownUserData* uud = ON_UnknownUserData::Cast(source_ud);
    if (nullptr == uud && false == uud->IsValid())
    {
      return nullptr;
    }
  }
  
  ON_UserData* dest_ud = bPerformConflictCheck ? GetUserData(source_ud->m_userdata_uuid) : nullptr;

  bool bDeleteDestinationItem = false;
  bool bTransferSourceItem; // no initialization
  if (nullptr == dest_ud)
  {
    bTransferSourceItem = true;
  }
  else
  {
    switch (userdata_conflict_resolution)
    {
    case ON_Object::UserDataConflictResolution::destination_object:
      bTransferSourceItem = false;
      break;

    case ON_Object::UserDataConflictResolution::source_object:
      bTransferSourceItem = true;
      break;

    case ON_Object::UserDataConflictResolution::source_copycount_gt:
      bTransferSourceItem = (source_ud->m_userdata_copycount > dest_ud->m_userdata_copycount);
      break;

    case ON_Object::UserDataConflictResolution::source_copycount_ge:
      bTransferSourceItem =  (source_ud->m_userdata_copycount >= dest_ud->m_userdata_copycount);
      break;

    case ON_Object::UserDataConflictResolution::destination_copycount_gt:
      bTransferSourceItem = (dest_ud->m_userdata_copycount > source_ud->m_userdata_copycount);
      break;

    case ON_Object::UserDataConflictResolution::destination_copycount_ge:
      bTransferSourceItem =  (dest_ud->m_userdata_copycount >= source_ud->m_userdata_copycount);
      break;

    case ON_Object::UserDataConflictResolution::delete_item:
      bTransferSourceItem = false;
      bDeleteDestinationItem = true;
      break;

    default:
      bTransferSourceItem = false;
      break;
    }
  }

  if (false == bTransferSourceItem)
  {
    if (bDeleteDestinationItem && nullptr != dest_ud)
    {
      delete dest_ud;
    }
    return nullptr;
  }


  if (nullptr != source_ud_copy_this)
  {
    ON_Object* p = source_ud_copy_this->Duplicate();
    if ( nullptr == p )
      return nullptr;
    source_ud_move_this = ON_UserData::Cast(p);

    if (nullptr == source_ud_move_this)
    {
      delete p;
      return nullptr;
    }
    source_ud_move_this->m_userdata_owner = nullptr;
  }

  if (nullptr == source_ud_move_this)
  {
    ON_ERROR("Bug in the code above.");
    return nullptr;
  }

  if (nullptr != dest_ud)
  {
    delete dest_ud;
  }

  source_ud_move_this->m_userdata_owner = this;
  source_ud_move_this->m_userdata_next = m_userdata_list;
  m_userdata_list = source_ud_move_this;
  
  return m_userdata_list;
}